

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::alloc
          (array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_> *this
          ,int new_len)

{
  undefined8 uVar1;
  CCountryFlag *pCVar2;
  CCountryFlag *pCVar3;
  undefined8 *puVar4;
  undefined4 in_ESI;
  long *in_RDI;
  int unaff_retaddr;
  int i;
  int end;
  CCountryFlag *new_list;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  int iVar6;
  int local_20;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pCVar2 = allocator_default<CCountryFlags::CCountryFlag>::alloc_array(unaff_retaddr);
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    iVar6 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar6 = (int)in_RDI[1];
  }
  for (local_20 = 0; local_20 < iVar6; local_20 = local_20 + 1) {
    puVar4 = (undefined8 *)(*in_RDI + (long)local_20 * 0x14);
    pCVar3 = pCVar2 + local_20;
    uVar1 = *puVar4;
    pCVar3->m_CountryCode = (int)uVar1;
    pCVar3->m_aCountryCodeString[0] = (char)((ulong)uVar1 >> 0x20);
    pCVar3->m_aCountryCodeString[1] = (char)((ulong)uVar1 >> 0x28);
    pCVar3->m_aCountryCodeString[2] = (char)((ulong)uVar1 >> 0x30);
    pCVar3->m_aCountryCodeString[3] = (char)((ulong)uVar1 >> 0x38);
    *(undefined8 *)(pCVar3->m_aCountryCodeString + 4) = puVar4[1];
    (pCVar3->m_Texture).m_Id = *(int *)(puVar4 + 2);
  }
  allocator_default<CCountryFlags::CCountryFlag>::free_array
            ((CCountryFlag *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    uVar5 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar5 = (undefined4)in_RDI[1];
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar5;
  *in_RDI = (long)pCVar2;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}